

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NFA.hpp
# Opt level: O0

void __thiscall
Centaurus::NFABaseState<wchar_t,_int>::rebase_transitions
          (NFABaseState<wchar_t,_int> *this,NFABaseState<wchar_t,_int> *src,int offset_value)

{
  bool bVar1;
  NFATransition<wchar_t> local_78;
  reference local_40;
  NFATransition<wchar_t> *i;
  const_iterator __end0;
  const_iterator __begin0;
  vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
  *__range2;
  int offset_value_local;
  NFABaseState<wchar_t,_int> *src_local;
  NFABaseState<wchar_t,_int> *this_local;
  
  __end0 = std::
           vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
           ::begin(&src->m_transitions);
  i = (NFATransition<wchar_t> *)
      std::
      vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>
      ::end(&src->m_transitions);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
                                *)&i);
    if (!bVar1) break;
    local_40 = __gnu_cxx::
               __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
               ::operator*(&__end0);
    NFATransition<wchar_t>::offset(&local_78,local_40,offset_value);
    add_transition(this,&local_78);
    NFATransition<wchar_t>::~NFATransition(&local_78);
    __gnu_cxx::
    __normal_iterator<const_Centaurus::NFATransition<wchar_t>_*,_std::vector<Centaurus::NFATransition<wchar_t>,_std::allocator<Centaurus::NFATransition<wchar_t>_>_>_>
    ::operator++(&__end0);
  }
  return;
}

Assistant:

void rebase_transitions(const NFABaseState<TCHAR, TLABEL>& src, int offset_value)
    {
        for (const auto& i : src.m_transitions)
        {
            add_transition(i.offset(offset_value));
        }
    }